

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O0

void __thiscall
LASwriteItemCompressed_POINT14_v4::LASwriteItemCompressed_POINT14_v4
          (LASwriteItemCompressed_POINT14_v4 *this,ArithmeticEncoder *enc)

{
  LASwriteItemCompressed_POINT14_v4 *local_30;
  uint local_28;
  U32 c;
  ArithmeticEncoder *enc_local;
  LASwriteItemCompressed_POINT14_v4 *this_local;
  
  LASwriteItemCompressed::LASwriteItemCompressed(&this->super_LASwriteItemCompressed);
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_001b11e0;
  local_30 = (LASwriteItemCompressed_POINT14_v4 *)this->contexts;
  do {
    LAScontextPOINT14::LAScontextPOINT14((LAScontextPOINT14 *)local_30);
    local_30 = (LASwriteItemCompressed_POINT14_v4 *)(local_30->contexts[0].m_user_data + 0x35);
  } while (local_30 != this + 1);
  if (enc != (ArithmeticEncoder *)0x0) {
    this->enc = enc;
    this->outstream_channel_returns_XY = (ByteStreamOutArray *)0x0;
    this->outstream_Z = (ByteStreamOutArray *)0x0;
    this->outstream_classification = (ByteStreamOutArray *)0x0;
    this->outstream_flags = (ByteStreamOutArray *)0x0;
    this->outstream_intensity = (ByteStreamOutArray *)0x0;
    this->outstream_scan_angle = (ByteStreamOutArray *)0x0;
    this->outstream_user_data = (ByteStreamOutArray *)0x0;
    this->outstream_point_source = (ByteStreamOutArray *)0x0;
    this->outstream_gps_time = (ByteStreamOutArray *)0x0;
    this->changed_classification = false;
    this->changed_flags = false;
    this->changed_intensity = false;
    this->changed_scan_angle = false;
    this->changed_user_data = false;
    this->changed_point_source = false;
    this->changed_gps_time = false;
    this->enc_channel_returns_XY = (ArithmeticEncoder *)0x0;
    this->enc_Z = (ArithmeticEncoder *)0x0;
    this->enc_classification = (ArithmeticEncoder *)0x0;
    this->enc_flags = (ArithmeticEncoder *)0x0;
    this->enc_intensity = (ArithmeticEncoder *)0x0;
    this->enc_scan_angle = (ArithmeticEncoder *)0x0;
    this->enc_user_data = (ArithmeticEncoder *)0x0;
    this->enc_point_source = (ArithmeticEncoder *)0x0;
    this->enc_gps_time = (ArithmeticEncoder *)0x0;
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      this->contexts[local_28].m_changed_values[0] = (ArithmeticModel *)0x0;
    }
    this->current_context = 0;
    this->num_bytes_channel_returns_XY = 0;
    this->num_bytes_Z = 0;
    this->num_bytes_classification = 0;
    this->num_bytes_flags = 0;
    this->num_bytes_intensity = 0;
    this->num_bytes_scan_angle = 0;
    this->num_bytes_user_data = 0;
    this->num_bytes_point_source = 0;
    this->num_bytes_gps_time = 0;
    return;
  }
  __assert_fail("enc",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/laswriteitemcompressed_v4.cpp"
                ,0x5d,
                "LASwriteItemCompressed_POINT14_v4::LASwriteItemCompressed_POINT14_v4(ArithmeticEncoder *)"
               );
}

Assistant:

LASwriteItemCompressed_POINT14_v4::LASwriteItemCompressed_POINT14_v4(ArithmeticEncoder* enc)
{
  /* not used as a encoder. just gives access to outstream */

  assert(enc);
  this->enc = enc;

  /* zero outstreams and encoders */

  outstream_channel_returns_XY = 0;
  outstream_Z = 0;
  outstream_classification = 0;
  outstream_flags = 0;
  outstream_intensity = 0;
  outstream_scan_angle = 0;
  outstream_user_data = 0;
  outstream_point_source = 0;
  outstream_gps_time = 0;

  changed_classification = FALSE;
  changed_flags = FALSE;
  changed_intensity = FALSE;
  changed_scan_angle = FALSE;
  changed_user_data = FALSE;
  changed_point_source = FALSE;
  changed_gps_time = FALSE;

  enc_channel_returns_XY = 0;
  enc_Z = 0;
  enc_classification = 0;
  enc_flags = 0;
  enc_intensity = 0;
  enc_scan_angle = 0;
  enc_user_data = 0;
  enc_point_source = 0;
  enc_gps_time = 0;

  /* mark the four scanner channel contexts as uninitialized */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].m_changed_values[0] = 0;
  }
  current_context = 0;

  /* number of bytes per layer */
  
  num_bytes_channel_returns_XY = 0;
  num_bytes_Z = 0;
  num_bytes_classification = 0;
  num_bytes_flags = 0;
  num_bytes_intensity = 0;
  num_bytes_scan_angle = 0;
  num_bytes_user_data = 0;
  num_bytes_point_source = 0;
  num_bytes_gps_time = 0;
}